

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O1

void __thiscall
QTeamCityLogger::tcEscapedString(QTeamCityLogger *this,QTestCharBuffer *buf,char *str)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  void *pvVar5;
  byte *pbVar6;
  byte bVar7;
  char *pcVar8;
  int newSize;
  long lVar9;
  
  if (str == (char *)0x0) {
    lVar9 = 1;
  }
  else {
    sVar4 = strlen(str);
    lVar9 = sVar4 + 1;
  }
  newSize = (int)lVar9;
  cVar3 = *str;
  if (cVar3 != '\0') {
    pcVar8 = str + 1;
    do {
      pvVar5 = memchr("\n\r|[]\'",(int)cVar3,7);
      lVar9 = (lVar9 + 1) - (ulong)(pvVar5 == (void *)0x0);
      newSize = (int)lVar9;
      cVar3 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar3 != '\0');
  }
  if (buf->_size < newSize) {
    QTestCharBuffer::reset(buf,newSize,true);
  }
  pbVar6 = (byte *)buf->buf;
  bVar1 = true;
  do {
    bVar7 = *str;
    if (bVar7 < 0x27) {
      if (bVar7 == 10) {
        bVar7 = 0x6e;
      }
      else {
        if (bVar7 != 0xd) {
          if (bVar7 == 0) {
            if (bVar1) {
              pbVar6 = pbVar6 + -(ulong)(buf->buf < pbVar6);
            }
            *pbVar6 = 0;
            return;
          }
          goto LAB_0012859b;
        }
        bVar7 = 0x72;
      }
LAB_00128580:
      *pbVar6 = 0x7c;
      pbVar6 = pbVar6 + 1;
      bVar2 = false;
LAB_00128589:
      bVar1 = bVar2;
      *pbVar6 = bVar7;
      pbVar6 = pbVar6 + 1;
    }
    else {
      if (((bVar7 - 0x5b < 0x22) && ((0x200000005U >> ((ulong)(bVar7 - 0x5b) & 0x3f) & 1) != 0)) ||
         (bVar7 == 0x27)) goto LAB_00128580;
LAB_0012859b:
      bVar2 = false;
      if ((0x3f < bVar7) || ((1L << (bVar7 & 0x3f) & 0x100003e00U) == 0)) goto LAB_00128589;
      if (!bVar1) {
        bVar7 = 0x20;
        bVar2 = true;
        goto LAB_00128589;
      }
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

void QTeamCityLogger::tcEscapedString(QTestCharBuffer *buf, const char *str) const
{
    {
        size_t size = qstrlen(str) + 1;
        for (const char *p = str; *p; ++p) {
            if (strchr("\n\r|[]'", *p))
                ++size;
        }
        Q_ASSERT(size <= size_t(INT_MAX));
        buf->resize(int(size));
    }

    bool swallowSpace = true;
    char *p = buf->data();
    for (; *str; ++str) {
        char ch = *str;
        switch (ch) {
        case '\n':
            p++[0] = '|';
            ch = 'n';
            swallowSpace = false;
            break;
        case '\r':
            p++[0] = '|';
            ch = 'r';
            swallowSpace = false;
            break;
        case '|':
        case '[':
        case ']':
        case '\'':
            p++[0] = '|';
            swallowSpace = false;
            break;
        default:
            if (ascii_isspace(ch)) {
                if (swallowSpace)
                    continue;
                swallowSpace = true;
                ch = ' ';
            } else {
                swallowSpace = false;
            }
            break;
        }
        p++[0] = ch;
    }
    Q_ASSERT(p < buf->data() + buf->size());
    if (swallowSpace && p > buf->data()) {
        Q_ASSERT(p[-1] == ' ');
        --p;
    }
    Q_ASSERT(p == buf->data() || !ascii_isspace(p[-1]));
    *p = '\0';
}